

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O1

void parse_source(Context_conflict *ctx,char *filename,char *source,uint sourcelen,
                 MOJOSHADER_preprocessorDefine *defines,uint define_count,
                 MOJOSHADER_includeOpen include_open,MOJOSHADER_includeClose include_close)

{
  ushort uVar1;
  Context_conflict *pCVar2;
  MOJOSHADER_free p_Var3;
  void *pvVar4;
  SymbolMap *map;
  SymbolScope *pSVar5;
  uint uVar6;
  Preprocessor *ctx_00;
  yyParser *yypParser;
  char *pcVar7;
  char *pcVar8;
  MOJOSHADER_astDataType *pMVar9;
  ulong uVar10;
  ushort *puVar11;
  SymbolScope *pSVar12;
  long lVar13;
  int iVar14;
  long *plVar15;
  long lVar16;
  uchar yymajor;
  Token yyMajor;
  ulong uVar17;
  Token TVar18;
  yyParser *pParser;
  bool bVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  uint tokenlen;
  int local_60;
  Token tokenval;
  void *value;
  SymbolMap *local_50;
  SymbolMap *local_48;
  SymbolScope *local_40;
  uint *local_38;
  
  if (include_open == (MOJOSHADER_includeOpen)0x0) {
    include_open = MOJOSHADER_internal_include_open;
  }
  if (include_close == (MOJOSHADER_includeClose)0x0) {
    include_close = MOJOSHADER_internal_include_close;
  }
  ctx_00 = preprocessor_start(filename,source,sourcelen,include_open,include_close,defines,
                              define_count,0,MallocBridge,FreeBridge,ctx);
  if (ctx_00 == (Preprocessor *)0x0) {
    if (ctx->out_of_memory == 0) {
      __assert_fail("ctx->out_of_memory",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x113a,
                    "void parse_source(Context *, const char *, const char *, unsigned int, const MOJOSHADER_preprocessorDefine *, unsigned int, MOJOSHADER_includeOpen, MOJOSHADER_includeClose)"
                   );
    }
  }
  else {
    yypParser = (yyParser *)(*ctx->malloc)(0x650,ctx->malloc_data);
    if (yypParser == (yyParser *)0x0) {
      if (ctx->out_of_memory == 0) {
        __assert_fail("ctx->out_of_memory",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                      ,0x1141,
                      "void parse_source(Context *, const char *, const char *, unsigned int, const MOJOSHADER_preprocessorDefine *, unsigned int, MOJOSHADER_includeOpen, MOJOSHADER_includeClose)"
                     );
      }
    }
    else {
      yypParser->yyidx = -1;
      init_builtins(ctx);
      local_50 = &ctx->usertypes;
      local_40 = (ctx->usertypes).scope;
      local_38 = &ctx->sourceline;
      local_48 = &ctx->variables;
      local_60 = 0;
      bVar19 = false;
      do {
        pcVar7 = preprocessor_nexttoken(ctx_00,&tokenlen,&tokenval);
        if (ctx->out_of_memory != 0) break;
        pcVar8 = preprocessor_sourcepos(ctx_00,local_38);
        if (pcVar8 == (char *)0x0) {
          pcVar8 = (char *)0x0;
        }
        else {
          pcVar8 = stringcache(ctx->strcache,pcVar8);
        }
        ctx->sourcefile = pcVar8;
        if (tokenval - TOKEN_HASH < 2) {
          tokenval = TOKEN_BAD_CHARS;
        }
        if ((int)tokenval < 0x11f) {
          if (tokenval == 10) {
            bVar19 = false;
            bVar20 = local_60 == 0;
            local_60 = 0;
            if (bVar20) {
              __assert_fail("is_pragma",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                            ,0x1175,
                            "void parse_source(Context *, const char *, const char *, unsigned int, const MOJOSHADER_preprocessorDefine *, unsigned int, MOJOSHADER_includeOpen, MOJOSHADER_includeClose)"
                           );
            }
          }
          else {
            if (tokenval == TOKEN_BAD_CHARS) {
              pcVar7 = "Bad characters in source file";
              goto LAB_00123b0c;
            }
LAB_00123adb:
            if (bVar19) {
              bVar19 = true;
            }
            else {
              if ((int)tokenval < 0x5e) {
                TVar18 = tokenval;
                switch(tokenval) {
                case 0x21:
                case 0x28:
                case 0x29:
                  break;
                case 0x22:
                case 0x23:
                case 0x24:
                case 0x27:
                case 0x30:
                case 0x31:
                case 0x32:
                case 0x33:
                case 0x34:
                case 0x35:
                case 0x36:
                case 0x37:
                case 0x38:
                case 0x39:
                  goto switchD_00123b54_caseD_119;
                case 0x25:
                  TVar18 = 0x1f;
                  break;
                case 0x26:
                  TVar18 = 0x12;
                  break;
                case 0x2a:
                  TVar18 = 0x1d;
                  break;
                case 0x2b:
                  TVar18 = 0x1b;
                  break;
                case 0x2c:
                  TVar18 = 1;
                  break;
                case 0x2d:
                  TVar18 = 0x1c;
                  break;
                case 0x2e:
                  TVar18 = 0x25;
                  break;
                case 0x2f:
                  TVar18 = 0x1e;
                  break;
                case 0x3a:
                  TVar18 = 0x35;
                  break;
                case 0x3b:
                  TVar18 = 0x2b;
                  break;
                case 0x3c:
                  TVar18 = 0x15;
                  break;
                case 0x3d:
                  TVar18 = 2;
                  break;
                case 0x3e:
                  TVar18 = 0x17;
                  break;
                case 0x3f:
                  TVar18 = 0xd;
                  break;
                default:
                  if (tokenval == 0x5b) {
                    TVar18 = 0x26;
                  }
                  else {
                    if (tokenval != 0x5d) goto switchD_00123b54_caseD_119;
                    TVar18 = 0x27;
                  }
                }
              }
              else {
                switch(tokenval) {
                case TOKEN_IDENTIFIER:
                  if ((tokenlen == 4) && ((int)*(long *)pcVar7 == 0x65736c65)) {
                    TVar18 = 0x2a;
                  }
                  else if ((tokenlen == 6) &&
                          (*(short *)((long)pcVar7 + 4) == 0x656e &&
                           (int)*(long *)pcVar7 == 0x696c6e69)) {
                    TVar18 = 0x30;
                  }
                  else if ((tokenlen == 4) && ((int)*(long *)pcVar7 == 0x64696f76)) {
                    TVar18 = 0x2f;
                  }
                  else if ((tokenlen == 2) && ((short)*(long *)pcVar7 == 0x6e69)) {
                    TVar18 = 0x31;
                  }
                  else if ((tokenlen == 5) &&
                          (*(char *)((long)pcVar7 + 4) == 't' && (int)*(long *)pcVar7 == 0x756f6e69)
                          ) {
                    TVar18 = 0x32;
                  }
                  else if ((tokenlen == 3) &&
                          (*(char *)((long)pcVar7 + 2) == 't' && (short)*(long *)pcVar7 == 0x756f))
                  {
                    TVar18 = 0x33;
                  }
                  else if ((tokenlen == 7) &&
                          (*(int *)((long)pcVar7 + 3) == 0x6d726f66 &&
                           (int)*(long *)pcVar7 == 0x66696e75)) {
                    TVar18 = 0x34;
                  }
                  else if ((tokenlen == 6) &&
                          (*(short *)((long)pcVar7 + 4) == 0x7261 &&
                           (int)*(long *)pcVar7 == 0x656e696c)) {
                    TVar18 = 0x36;
                  }
                  else if ((tokenlen == 8) && (*(long *)pcVar7 == 0x64696f72746e6563)) {
                    TVar18 = 0x37;
                  }
                  else if ((tokenlen == 0xf) &&
                          (*(long *)((long)pcVar7 + 7) == 0x6e6f6974616c6f70 &&
                           *(long *)pcVar7 == 0x707265746e696f6e)) {
                    TVar18 = 0x38;
                  }
                  else if ((tokenlen == 0xd) &&
                          (*(long *)((long)pcVar7 + 5) == 0x6576697463657073 &&
                           *(long *)pcVar7 == 0x6570737265706f6e)) {
                    TVar18 = 0x39;
                  }
                  else if (tokenlen == 6) {
                    if (*(short *)((long)pcVar7 + 4) == 0x656c && (int)*(long *)pcVar7 == 0x706d6173
                       ) {
                      TVar18 = 0x3a;
                    }
                    else {
                      if (*(short *)((long)pcVar7 + 4) != 0x7463 ||
                          (int)*(long *)pcVar7 != 0x75727473) goto LAB_00123cca;
                      TVar18 = 0x43;
                    }
                  }
                  else {
LAB_00123cca:
                    if ((tokenlen == 7) &&
                       (*(int *)((long)pcVar7 + 3) == 0x66656465 &&
                        (int)*(long *)pcVar7 == 0x65707974)) {
                      TVar18 = 0x2c;
                    }
                    else if ((tokenlen == 5) &&
                            (*(char *)((long)pcVar7 + 4) == 't' &&
                             (int)*(long *)pcVar7 == 0x736e6f63)) {
                      TVar18 = 0x2d;
                    }
                    else if ((tokenlen == 10) &&
                            ((short)*(long *)((long)pcVar7 + 8) == 0x7465 &&
                             *(long *)pcVar7 == 0x7366666f6b636170)) {
                      TVar18 = 0x44;
                    }
                    else if ((tokenlen == 8) && (*(long *)pcVar7 == 0x7265747369676572)) {
                      TVar18 = 0x45;
                    }
                    else if (tokenlen == 6) {
                      if (*(short *)((long)pcVar7 + 4) == 0x6e72 &&
                          (int)*(long *)pcVar7 == 0x65747865) {
                        TVar18 = 0x3b;
                      }
                      else if (*(short *)((long)pcVar7 + 4) == 0x6465 &&
                               (int)*(long *)pcVar7 == 0x72616873) {
                        TVar18 = 0x3c;
                      }
                      else {
                        if (*(short *)((long)pcVar7 + 4) != 0x6369 ||
                            (int)*(long *)pcVar7 != 0x74617473) goto LAB_00123d96;
                        TVar18 = 0x3d;
                      }
                    }
                    else {
LAB_00123d96:
                      if ((tokenlen == 8) && (*(long *)pcVar7 == 0x656c6974616c6f76)) {
                        TVar18 = 0x3e;
                      }
                      else if ((tokenlen == 9) &&
                              ((char)*(long *)((long)pcVar7 + 8) == 'r' &&
                               *(long *)pcVar7 == 0x6f6a616d5f776f72)) {
                        TVar18 = 0x3f;
                      }
                      else if ((tokenlen == 0xc) &&
                              ((int)*(long *)((long)pcVar7 + 8) == 0x726f6a61 &&
                               *(long *)pcVar7 == 0x6d5f6e6d756c6f63)) {
                        TVar18 = 0x40;
                      }
                      else if ((tokenlen == 4) && ((int)*(long *)pcVar7 == 0x6c6f6f62)) {
                        TVar18 = 0x4f;
                      }
                      else if ((tokenlen == 3) &&
                              (*(char *)((long)pcVar7 + 2) == 't' &&
                               (short)*(long *)pcVar7 == 0x6e69)) {
                        TVar18 = 0x50;
                      }
                      else if (tokenlen == 4) {
                        if ((int)*(long *)pcVar7 == 0x746e6975) {
                          TVar18 = 0x51;
                        }
                        else {
                          if ((int)*(long *)pcVar7 != 0x666c6168) goto LAB_00123e48;
                          TVar18 = 0x52;
                        }
                      }
                      else {
LAB_00123e48:
                        if ((tokenlen == 5) &&
                           (*(char *)((long)pcVar7 + 4) == 't' && (int)*(long *)pcVar7 == 0x616f6c66
                           )) {
                          TVar18 = 0x53;
                        }
                        else if (tokenlen == 6) {
                          if (*(short *)((long)pcVar7 + 4) == 0x656c &&
                              (int)*(long *)pcVar7 == 0x62756f64) {
                            TVar18 = 0x54;
                          }
                          else {
                            if (*(short *)((long)pcVar7 + 4) != 0x676e ||
                                (int)*(long *)pcVar7 != 0x69727473) goto LAB_00123e9d;
                            TVar18 = 0x55;
                          }
                        }
                        else {
LAB_00123e9d:
                          if (tokenlen == 5) {
                            if (*(char *)((long)pcVar7 + 4) == 'm' &&
                                (int)*(long *)pcVar7 == 0x726f6e73) {
                              TVar18 = 0x56;
                            }
                            else {
                              if (*(char *)((long)pcVar7 + 4) != 'm' ||
                                  (int)*(long *)pcVar7 != 0x726f6e75) goto LAB_00123ed0;
                              TVar18 = 0x57;
                            }
                          }
                          else {
LAB_00123ed0:
                            if (tokenlen == 6) {
                              if (*(short *)((long)pcVar7 + 4) == 0x7265 &&
                                  (int)*(long *)pcVar7 == 0x66667562) {
                                TVar18 = 0x58;
                              }
                              else if (*(short *)((long)pcVar7 + 4) == 0x726f &&
                                       (int)*(long *)pcVar7 == 0x74636576) {
                                TVar18 = 0x59;
                              }
                              else {
                                if (*(short *)((long)pcVar7 + 4) != 0x7869 ||
                                    (int)*(long *)pcVar7 != 0x7274616d) goto LAB_00123f23;
                                TVar18 = 0x5b;
                              }
                            }
                            else {
LAB_00123f23:
                              if ((tokenlen == 5) &&
                                 (*(char *)((long)pcVar7 + 4) == 'k' &&
                                  (int)*(long *)pcVar7 == 0x61657262)) {
                                TVar18 = 0x62;
                              }
                              else if ((tokenlen == 8) && (*(long *)pcVar7 == 0x65756e69746e6f63)) {
                                TVar18 = 99;
                              }
                              else if ((tokenlen == 7) &&
                                      (*(int *)((long)pcVar7 + 3) == 0x64726163 &&
                                       (int)*(long *)pcVar7 == 0x63736964)) {
                                TVar18 = 100;
                              }
                              else if ((tokenlen == 6) &&
                                      (*(short *)((long)pcVar7 + 4) == 0x6e72 &&
                                       (int)*(long *)pcVar7 == 0x75746572)) {
                                TVar18 = 0x67;
                              }
                              else if ((tokenlen == 5) &&
                                      (*(char *)((long)pcVar7 + 4) == 'e' &&
                                       (int)*(long *)pcVar7 == 0x6c696877)) {
                                TVar18 = 0x66;
                              }
                              else if ((tokenlen == 3) &&
                                      (*(char *)((long)pcVar7 + 2) == 'r' &&
                                       (short)*(long *)pcVar7 == 0x6f66)) {
                                TVar18 = 0x6a;
                              }
                              else if ((tokenlen == 6) &&
                                      (*(short *)((long)pcVar7 + 4) == 0x6c6c &&
                                       (int)*(long *)pcVar7 == 0x6f726e75)) {
                                TVar18 = 0x68;
                              }
                              else if ((tokenlen == 4) && ((int)*(long *)pcVar7 == 0x706f6f6c)) {
                                TVar18 = 0x69;
                              }
                              else if (tokenlen == 2) {
                                if ((short)*(long *)pcVar7 == 0x6f64) {
                                  TVar18 = 0x65;
                                }
                                else {
                                  if ((short)*(long *)pcVar7 != 0x6669) goto LAB_0012401c;
                                  TVar18 = 0x6c;
                                }
                              }
                              else {
LAB_0012401c:
                                if ((tokenlen == 6) &&
                                   (*(short *)((long)pcVar7 + 4) == 0x6863 &&
                                    (int)*(long *)pcVar7 == 0x6e617262)) {
                                  TVar18 = 0x6b;
                                }
                                else if ((tokenlen == 7) &&
                                        (*(int *)((long)pcVar7 + 3) == 0x6e657474 &&
                                         (int)*(long *)pcVar7 == 0x74616c66)) {
                                  TVar18 = 0x6d;
                                }
                                else if ((tokenlen == 6) &&
                                        (*(short *)((long)pcVar7 + 4) == 0x6863 &&
                                         (int)*(long *)pcVar7 == 0x74697773)) {
                                  TVar18 = 0x72;
                                }
                                else if ((tokenlen == 9) &&
                                        ((char)*(long *)((long)pcVar7 + 8) == 'e' &&
                                         *(long *)pcVar7 == 0x7361636563726f66)) {
                                  TVar18 = 0x73;
                                }
                                else if (tokenlen == 4) {
                                  if ((int)*(long *)pcVar7 == 0x6c6c6163) {
                                    TVar18 = 0x74;
                                  }
                                  else {
                                    if ((int)*(long *)pcVar7 != 0x65736163) goto LAB_001240ba;
                                    TVar18 = 0x75;
                                  }
                                }
                                else {
LAB_001240ba:
                                  if (tokenlen == 7) {
                                    if (*(int *)((long)pcVar7 + 3) == 0x746c7561 &&
                                        (int)*(long *)pcVar7 == 0x61666564) {
                                      TVar18 = 0x76;
                                    }
                                    else {
                                      if (*(int *)((long)pcVar7 + 3) != 0x72656c70 ||
                                          (int)*(long *)pcVar7 != 0x706d6173) goto LAB_001240ef;
                                      TVar18 = 0x47;
                                    }
                                  }
                                  else {
LAB_001240ef:
                                    if (tokenlen == 9) {
                                      if ((char)*(long *)((long)pcVar7 + 8) == 'D' &&
                                          *(long *)pcVar7 == 0x3172656c706d6173) {
                                        TVar18 = 0x48;
                                      }
                                      else if ((char)*(long *)((long)pcVar7 + 8) == 'D' &&
                                               *(long *)pcVar7 == 0x3272656c706d6173) {
                                        TVar18 = 0x49;
                                      }
                                      else {
                                        if ((char)*(long *)((long)pcVar7 + 8) != 'D' ||
                                            *(long *)pcVar7 != 0x3372656c706d6173)
                                        goto LAB_00124151;
                                        TVar18 = 0x4a;
                                      }
                                    }
                                    else {
LAB_00124151:
                                      if ((tokenlen == 0xb) &&
                                         (*(long *)((long)pcVar7 + 3) == 0x4542554372656c70 &&
                                          *(long *)pcVar7 == 0x4372656c706d6173)) {
                                        TVar18 = 0x4b;
                                      }
                                      else if ((tokenlen == 0xd) &&
                                              (*(long *)((long)pcVar7 + 5) == 0x65746174735f7265 &&
                                               *(long *)pcVar7 == 0x5f72656c706d6173)) {
                                        TVar18 = 0x4c;
                                      }
                                      else if ((tokenlen == 0xc) &&
                                              ((int)*(long *)((long)pcVar7 + 8) == 0x65746174 &&
                                               *(long *)pcVar7 == 0x5372656c706d6153)) {
                                        TVar18 = 0x4d;
                                      }
                                      else if ((tokenlen == 4) &&
                                              ((int)*(long *)pcVar7 == 0x65757274)) {
                                        TVar18 = 0x79;
                                      }
                                      else if ((tokenlen == 5) &&
                                              (*(char *)((long)pcVar7 + 4) == 'e' &&
                                               (int)*(long *)pcVar7 == 0x736c6166)) {
                                        TVar18 = 0x7a;
                                      }
                                      else if ((tokenlen == 0x16) &&
                                              (auVar24[0] = -(*(char *)((long)pcVar7 + 6) == 'r'),
                                              auVar24[1] = -(*(char *)((long)pcVar7 + 7) == 'C'),
                                              auVar24[2] = -((char)*(long *)((long)pcVar7 + 8) ==
                                                            'o'),
                                              auVar24[3] = -(*(char *)((long)pcVar7 + 9) == 'm'),
                                              auVar24[4] = -(*(char *)((long)pcVar7 + 10) == 'p'),
                                              auVar24[5] = -(*(char *)((long)pcVar7 + 0xb) == 'a'),
                                              auVar24[6] = -(*(char *)((long)pcVar7 + 0xc) == 'r'),
                                              auVar24[7] = -(*(char *)((long)pcVar7 + 0xd) == 'i'),
                                              auVar24[8] = -(*(char *)((long)pcVar7 + 0xe) == 's'),
                                              auVar24[9] = -(*(char *)((long)pcVar7 + 0xf) == 'o'),
                                              auVar24[10] = -((char)*(long *)((long)pcVar7 + 0x10)
                                                             == 'n'),
                                              auVar24[0xb] = -(*(char *)((long)pcVar7 + 0x11) == 'S'
                                                              ),
                                              auVar24[0xc] = -(*(char *)((long)pcVar7 + 0x12) == 't'
                                                              ),
                                              auVar24[0xd] = -(*(char *)((long)pcVar7 + 0x13) == 'a'
                                                              ),
                                              auVar24[0xe] = -(*(char *)((long)pcVar7 + 0x14) == 't'
                                                              ),
                                              auVar24[0xf] = -(*(char *)((long)pcVar7 + 0x15) == 'e'
                                                              ),
                                              auVar21[0] = -((char)*(long *)pcVar7 == 'S'),
                                              auVar21[1] = -(*(char *)((long)pcVar7 + 1) == 'a'),
                                              auVar21[2] = -(*(char *)((long)pcVar7 + 2) == 'm'),
                                              auVar21[3] = -(*(char *)((long)pcVar7 + 3) == 'p'),
                                              auVar21[4] = -(*(char *)((long)pcVar7 + 4) == 'l'),
                                              auVar21[5] = -(*(char *)((long)pcVar7 + 5) == 'e'),
                                              auVar21[6] = -(*(char *)((long)pcVar7 + 6) == 'r'),
                                              auVar21[7] = -(*(char *)((long)pcVar7 + 7) == 'C'),
                                              auVar21[8] = -((char)*(long *)((long)pcVar7 + 8) ==
                                                            'o'),
                                              auVar21[9] = -(*(char *)((long)pcVar7 + 9) == 'm'),
                                              auVar21[10] = -(*(char *)((long)pcVar7 + 10) == 'p'),
                                              auVar21[0xb] = -(*(char *)((long)pcVar7 + 0xb) == 'a')
                                              , auVar21[0xc] = -(*(char *)((long)pcVar7 + 0xc) ==
                                                                'r'),
                                              auVar21[0xd] = -(*(char *)((long)pcVar7 + 0xd) == 'i')
                                              , auVar21[0xe] = -(*(char *)((long)pcVar7 + 0xe) ==
                                                                's'),
                                              auVar21[0xf] = -(*(char *)((long)pcVar7 + 0xf) == 'o')
                                              , auVar21 = auVar21 & auVar24,
                                              (ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                                                       (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                                                       (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2
                                                       | (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) <<
                                                         3 | (ushort)(SUB161(auVar21 >> 0x27,0) & 1)
                                                             << 4 |
                                                       (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5
                                                       | (ushort)(SUB161(auVar21 >> 0x37,0) & 1) <<
                                                         6 | (ushort)(SUB161(auVar21 >> 0x3f,0) & 1)
                                                             << 7 |
                                                       (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8
                                                       | (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) <<
                                                         9 | (ushort)(SUB161(auVar21 >> 0x57,0) & 1)
                                                             << 10 |
                                                       (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) <<
                                                       0xb | (ushort)(SUB161(auVar21 >> 0x67,0) & 1)
                                                             << 0xc |
                                                       (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) <<
                                                       0xd | (ushort)(SUB161(auVar21 >> 0x77,0) & 1)
                                                             << 0xe |
                                                      (ushort)(byte)(auVar21[0xf] >> 7) << 0xf) ==
                                              0xffff)) {
                                        TVar18 = 0x4e;
                                      }
                                      else if ((tokenlen == 7) &&
                                              (*(int *)((long)pcVar7 + 3) == 0x6574616c &&
                                               (int)*(long *)pcVar7 == 0x6c6f7369)) {
                                        TVar18 = 0x5c;
                                      }
                                      else if (tokenlen == 0x19) {
                                        auVar26[0] = -(*(char *)((long)pcVar7 + 9) == 'i');
                                        auVar26[1] = -(*(char *)((long)pcVar7 + 10) == 'o');
                                        auVar26[2] = -(*(char *)((long)pcVar7 + 0xb) == 'n');
                                        auVar26[3] = -(*(char *)((long)pcVar7 + 0xc) == 'O');
                                        auVar26[4] = -(*(char *)((long)pcVar7 + 0xd) == 'p');
                                        auVar26[5] = -(*(char *)((long)pcVar7 + 0xe) == 't');
                                        auVar26[6] = -(*(char *)((long)pcVar7 + 0xf) == 'i');
                                        auVar26[7] = -((char)*(long *)((long)pcVar7 + 0x10) == 'm');
                                        auVar26[8] = -(*(char *)((long)pcVar7 + 0x11) == 'i');
                                        auVar26[9] = -(*(char *)((long)pcVar7 + 0x12) == 'z');
                                        auVar26[10] = -(*(char *)((long)pcVar7 + 0x13) == 'a');
                                        auVar26[0xb] = -(*(char *)((long)pcVar7 + 0x14) == 't');
                                        auVar26[0xc] = -(*(char *)((long)pcVar7 + 0x15) == 'i');
                                        auVar26[0xd] = -(*(char *)((long)pcVar7 + 0x16) == 'o');
                                        auVar26[0xe] = -(*(char *)((long)pcVar7 + 0x17) == 'n');
                                        auVar26[0xf] = -((char)*(long *)((long)pcVar7 + 0x18) == 's'
                                                        );
                                        auVar23[0] = -((char)*(long *)pcVar7 == 'n');
                                        auVar23[1] = -(*(char *)((long)pcVar7 + 1) == 'o');
                                        auVar23[2] = -(*(char *)((long)pcVar7 + 2) == 'E');
                                        auVar23[3] = -(*(char *)((long)pcVar7 + 3) == 'x');
                                        auVar23[4] = -(*(char *)((long)pcVar7 + 4) == 'p');
                                        auVar23[5] = -(*(char *)((long)pcVar7 + 5) == 'r');
                                        auVar23[6] = -(*(char *)((long)pcVar7 + 6) == 'e');
                                        auVar23[7] = -(*(char *)((long)pcVar7 + 7) == 's');
                                        auVar23[8] = -((char)*(long *)((long)pcVar7 + 8) == 's');
                                        auVar23[9] = -(*(char *)((long)pcVar7 + 9) == 'i');
                                        auVar23[10] = -(*(char *)((long)pcVar7 + 10) == 'o');
                                        auVar23[0xb] = -(*(char *)((long)pcVar7 + 0xb) == 'n');
                                        auVar23[0xc] = -(*(char *)((long)pcVar7 + 0xc) == 'O');
                                        auVar23[0xd] = -(*(char *)((long)pcVar7 + 0xd) == 'p');
                                        auVar23[0xe] = -(*(char *)((long)pcVar7 + 0xe) == 't');
                                        auVar23[0xf] = -(*(char *)((long)pcVar7 + 0xf) == 'i');
                                        auVar23 = auVar23 & auVar26;
                                        if ((ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                                                     (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                                                     (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                                                     (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                                                     (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                                                     (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                                                     (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                                                     (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                                                     (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                                                     (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                                                     (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                                                     (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb
                                                     | (ushort)(SUB161(auVar23 >> 0x67,0) & 1) <<
                                                       0xc | (ushort)(SUB161(auVar23 >> 0x6f,0) & 1)
                                                             << 0xd |
                                                     (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe
                                                    | (ushort)(byte)(auVar23[0xf] >> 7) << 0xf) !=
                                            0xffff) goto LAB_001242b1;
                                        TVar18 = 0x5e;
                                      }
                                      else if ((tokenlen == 0x13) &&
                                              (auVar25[0] = -(*(char *)((long)pcVar7 + 3) == 'I'),
                                              auVar25[1] = -(*(char *)((long)pcVar7 + 4) == 'n'),
                                              auVar25[2] = -(*(char *)((long)pcVar7 + 5) == 's'),
                                              auVar25[3] = -(*(char *)((long)pcVar7 + 6) == 't'),
                                              auVar25[4] = -(*(char *)((long)pcVar7 + 7) == 'r'),
                                              auVar25[5] = -((char)*(long *)((long)pcVar7 + 8) ==
                                                            'u'),
                                              auVar25[6] = -(*(char *)((long)pcVar7 + 9) == 'c'),
                                              auVar25[7] = -(*(char *)((long)pcVar7 + 10) == 't'),
                                              auVar25[8] = -(*(char *)((long)pcVar7 + 0xb) == 'i'),
                                              auVar25[9] = -(*(char *)((long)pcVar7 + 0xc) == 'o'),
                                              auVar25[10] = -(*(char *)((long)pcVar7 + 0xd) == 'n'),
                                              auVar25[0xb] = -(*(char *)((long)pcVar7 + 0xe) == 'C')
                                              , auVar25[0xc] = -(*(char *)((long)pcVar7 + 0xf) ==
                                                                'o'),
                                              auVar25[0xd] = -((char)*(long *)((long)pcVar7 + 0x10)
                                                              == 'u'),
                                              auVar25[0xe] = -(*(char *)((long)pcVar7 + 0x11) == 'n'
                                                              ),
                                              auVar25[0xf] = -(*(char *)((long)pcVar7 + 0x12) == 't'
                                                              ),
                                              auVar22[0] = -((char)*(long *)pcVar7 == 'm'),
                                              auVar22[1] = -(*(char *)((long)pcVar7 + 1) == 'a'),
                                              auVar22[2] = -(*(char *)((long)pcVar7 + 2) == 'x'),
                                              auVar22[3] = -(*(char *)((long)pcVar7 + 3) == 'I'),
                                              auVar22[4] = -(*(char *)((long)pcVar7 + 4) == 'n'),
                                              auVar22[5] = -(*(char *)((long)pcVar7 + 5) == 's'),
                                              auVar22[6] = -(*(char *)((long)pcVar7 + 6) == 't'),
                                              auVar22[7] = -(*(char *)((long)pcVar7 + 7) == 'r'),
                                              auVar22[8] = -((char)*(long *)((long)pcVar7 + 8) ==
                                                            'u'),
                                              auVar22[9] = -(*(char *)((long)pcVar7 + 9) == 'c'),
                                              auVar22[10] = -(*(char *)((long)pcVar7 + 10) == 't'),
                                              auVar22[0xb] = -(*(char *)((long)pcVar7 + 0xb) == 'i')
                                              , auVar22[0xc] = -(*(char *)((long)pcVar7 + 0xc) ==
                                                                'o'),
                                              auVar22[0xd] = -(*(char *)((long)pcVar7 + 0xd) == 'n')
                                              , auVar22[0xe] = -(*(char *)((long)pcVar7 + 0xe) ==
                                                                'C'),
                                              auVar22[0xf] = -(*(char *)((long)pcVar7 + 0xf) == 'o')
                                              , auVar22 = auVar22 & auVar25,
                                              (ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                                                       (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                                                       (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2
                                                       | (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) <<
                                                         3 | (ushort)(SUB161(auVar22 >> 0x27,0) & 1)
                                                             << 4 |
                                                       (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5
                                                       | (ushort)(SUB161(auVar22 >> 0x37,0) & 1) <<
                                                         6 | (ushort)(SUB161(auVar22 >> 0x3f,0) & 1)
                                                             << 7 |
                                                       (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8
                                                       | (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) <<
                                                         9 | (ushort)(SUB161(auVar22 >> 0x57,0) & 1)
                                                             << 10 |
                                                       (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) <<
                                                       0xb | (ushort)(SUB161(auVar22 >> 0x67,0) & 1)
                                                             << 0xc |
                                                       (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) <<
                                                       0xd | (ushort)(SUB161(auVar22 >> 0x77,0) & 1)
                                                             << 0xe |
                                                      (ushort)(byte)(auVar22[0xf] >> 7) << 0xf) ==
                                              0xffff)) {
                                        TVar18 = 0x5d;
                                      }
                                      else {
LAB_001242b1:
                                        if ((tokenlen == 6) &&
                                           (*(short *)((long)pcVar7 + 4) == 0x6465 &&
                                            (int)*(long *)pcVar7 == 0x73756e75)) {
                                          TVar18 = 0x60;
                                        }
                                        else if ((tokenlen == 3) &&
                                                (*(char *)((long)pcVar7 + 2) == 's' &&
                                                 (short)*(long *)pcVar7 == 0x7078)) {
                                          TVar18 = 0x61;
                                        }
                                        else {
                                          pcVar8 = stringcache_len(ctx->strcache,pcVar7,tokenlen);
                                          pMVar9 = get_usertype(ctx,pcVar8);
                                          TVar18 = 0x46;
                                          if (pMVar9 == (MOJOSHADER_astDataType *)0x0) {
                                            TVar18 = 0x2e;
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  break;
                case TOKEN_INT_LITERAL:
                  TVar18 = 0x5a;
                  break;
                case TOKEN_FLOAT_LITERAL:
                  TVar18 = 0x77;
                  break;
                case TOKEN_STRING_LITERAL:
                  TVar18 = 0x78;
                  break;
                case TOKEN_RSHIFTASSIGN:
                  TVar18 = 9;
                  break;
                case TOKEN_LSHIFTASSIGN:
                  TVar18 = 8;
                  break;
                case TOKEN_ADDASSIGN:
                  TVar18 = 3;
                  break;
                case TOKEN_SUBASSIGN:
                  TVar18 = 4;
                  break;
                case TOKEN_MULTASSIGN:
                  TVar18 = 5;
                  break;
                case TOKEN_DIVASSIGN:
                  TVar18 = 6;
                  break;
                case TOKEN_MODASSIGN:
                  TVar18 = 7;
                  break;
                case TOKEN_XORASSIGN:
                  TVar18 = 0xc;
                  break;
                case TOKEN_ANDASSIGN:
                  TVar18 = 10;
                  break;
                case TOKEN_ORASSIGN:
                  TVar18 = 0xb;
                  break;
                case TOKEN_INCREMENT:
                  TVar18 = 0x24;
                  break;
                case TOKEN_DECREMENT:
                  TVar18 = 0x23;
                  break;
                case TOKEN_RSHIFT:
                  TVar18 = 0x1a;
                  break;
                case TOKEN_LSHIFT:
                  TVar18 = 0x19;
                  break;
                case TOKEN_ANDAND:
                  TVar18 = 0xf;
                  break;
                case TOKEN_OROR:
                  TVar18 = 0xe;
                  break;
                case TOKEN_LEQ:
                  TVar18 = 0x16;
                  break;
                case TOKEN_GEQ:
                  TVar18 = 0x18;
                  break;
                case TOKEN_EQL:
                  TVar18 = 0x13;
                  break;
                case TOKEN_NEQ:
                  TVar18 = 0x14;
                  break;
                case TOKEN_HASH:
                case TOKEN_HASHHASH:
                case TOKEN_MULTI_COMMENT:
                case TOKEN_SINGLE_COMMENT:
switchD_00123b54_caseD_119:
                  __assert_fail("0 && \"unexpected token from lexer\\n\"",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                                ,0xdd5,
                                "int convert_to_lemon_token(Context *, const char *, unsigned int, const Token)"
                               );
                case TOKEN_EOI:
                  TVar18 = 0;
                  break;
                default:
                  switch(tokenval) {
                  case 0x7b:
                    TVar18 = 0x41;
                    break;
                  case 0x7c:
                    TVar18 = 0x10;
                    break;
                  case 0x7d:
                    TVar18 = 0x42;
                    break;
                  case 0x7e:
                    TVar18 = 0x22;
                    break;
                  default:
                    if (tokenval != 0x5e) goto switchD_00123b54_caseD_119;
                    TVar18 = 0x11;
                  }
                }
              }
              if ((int)TVar18 < 0x5a) {
                if (TVar18 == 0x2e) goto LAB_001245d7;
                pcVar8 = (char *)0x0;
                if (TVar18 == 0x46) {
                  pcVar7 = stringcache_len(ctx->strcache,pcVar7,tokenlen);
                  iVar14 = hash_find((ctx->usertypes).hash,pcVar7,&value);
                  if ((iVar14 == 0) || (value == (void *)0x0)) {
                    pcVar8 = (char *)0x0;
                  }
                  else {
                    pcVar8 = *(char **)((long)value + 8);
                  }
                  if (pcVar8 == (char *)0x0) {
                    __assert_fail("data.datatype != NULL",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                                  ,0x118f,
                                  "void parse_source(Context *, const char *, const char *, unsigned int, const MOJOSHADER_preprocessorDefine *, unsigned int, MOJOSHADER_includeOpen, MOJOSHADER_includeClose)"
                                 );
                  }
                }
              }
              else if (TVar18 == 0x78) {
LAB_001245d7:
                pcVar8 = stringcache_len(ctx->strcache,pcVar7,tokenlen);
              }
              else if (TVar18 == 0x77) {
                pcVar8 = (char *)strtodouble(pcVar7,tokenlen);
              }
              else {
                pcVar8 = (char *)0x0;
                if (TVar18 == 0x5a) {
                  uVar10 = (ulong)tokenlen;
                  lVar13 = 1;
                  if (uVar10 == 0) {
                    uVar10 = 0;
                  }
                  else {
                    plVar15 = (long *)((long)pcVar7 + uVar10);
                    do {
                      if ((char)*(long *)pcVar7 != ' ') {
                        if ((char)*(long *)pcVar7 == '-') {
                          pcVar7 = (char *)((long)pcVar7 + 1);
                          uVar10 = (ulong)((int)uVar10 - 1);
                          lVar13 = -1;
                        }
                        goto LAB_00124620;
                      }
                      pcVar7 = (char *)((long)pcVar7 + 1);
                      uVar6 = (int)uVar10 - 1;
                      uVar10 = (ulong)uVar6;
                    } while (uVar6 != 0);
                    uVar10 = 0;
                    pcVar7 = (char *)plVar15;
                  }
LAB_00124620:
                  uVar6 = (uint)uVar10;
                  iVar14 = 1;
                  uVar17 = 0;
                  do {
                    if (uVar10 == uVar17) goto LAB_00124649;
                    pcVar8 = (char *)((long)pcVar7 + uVar17);
                    uVar17 = uVar17 + 1;
                    iVar14 = iVar14 + -1;
                    bVar19 = (byte)(*pcVar8 - 0x30U) < 10;
                  } while (bVar19);
                  uVar6 = -(iVar14 - (uint)bVar19);
LAB_00124649:
                  if ((int)uVar6 < 1) {
                    pcVar8 = (char *)0x0;
                  }
                  else {
                    lVar16 = (ulong)uVar6 + 1;
                    pcVar8 = (char *)0x0;
                    do {
                      pcVar8 = pcVar8 + ((long)*(char *)((long)pcVar7 + lVar16 + -2) + -0x30) *
                                        lVar13;
                      lVar13 = lVar13 * 10;
                      lVar16 = lVar16 + -1;
                    } while (1 < lVar16);
                  }
                }
              }
              if (yypParser->yyidx < 0) {
                yypParser->yyidx = 0;
                yypParser->yyerrcnt = -1;
                yypParser->yystack[0].stateno = 0;
                yypParser->yystack[0].major = '\0';
              }
              yypParser->ctx = ctx;
              value = pcVar8;
              yyMajor = TVar18;
              do {
                uVar10 = (ulong)yypParser->yystack[yypParser->yyidx].stateno;
                yymajor = (uchar)yyMajor;
                if (uVar10 < 0x129) {
                  if (yymajor == 0xc6) {
                    __assert_fail("iLookAhead!=YYNOCODE",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_parser_hlsl.h"
                                  ,0x8d8,"int yy_find_shift_action(yyParser *, unsigned char)");
                  }
                  uVar6 = (yyMajor & 0xff) + (int)yy_shift_ofst[uVar10];
                  if ((0x151e < uVar6) || (yy_lookahead[uVar6] != yymajor)) goto LAB_001246f8;
                  puVar11 = yy_action + uVar6;
                }
                else {
LAB_001246f8:
                  puVar11 = yy_default + uVar10;
                }
                uVar1 = *puVar11;
                uVar6 = (uint)uVar1;
                if (uVar1 < 0x20d) {
                  if (TVar18 == 0) {
                    __assert_fail("!yyendofinput",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_parser_hlsl.h"
                                  ,0x1046,"void ParseHLSL(void *, int, TokenData, Context *)");
                  }
                  yy_shift(yypParser,uVar6,yyMajor,(YYMINORTYPE *)&value);
                  yypParser->yyerrcnt = yypParser->yyerrcnt + -1;
                  yyMajor = 0xc6;
                }
                else if (uVar1 < 0x32d) {
                  yy_reduce(yypParser,uVar6 - 0x20d);
                }
                else {
                  if (uVar6 != 0x32d) {
                    __assert_fail("yyact == YY_ERROR_ACTION",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_parser_hlsl.h"
                                  ,0x104d,"void ParseHLSL(void *, int, TokenData, Context *)");
                  }
                  if (yypParser->yyerrcnt < 1) {
                    pCVar2 = yypParser->ctx;
                    failf(pCVar2,"%s","Syntax error");
                    yypParser->ctx = pCVar2;
                  }
                  yypParser->yyerrcnt = 3;
                  yy_destructor(yypParser,yymajor,(YYMINORTYPE *)&value);
                  yyMajor = 0xc6;
                  if (TVar18 == 0) {
                    pCVar2 = yypParser->ctx;
                    while (-1 < yypParser->yyidx) {
                      yy_pop_parser_stack(yypParser);
                    }
                    failf(pCVar2,"%s","Giving up. Parser is hopelessly lost...");
                    yypParser->ctx = pCVar2;
                  }
                }
              } while ((yyMajor != 0xc6) && (-1 < yypParser->yyidx));
              bVar20 = false;
              if (TVar18 == 0x42) {
                pop_symbol_scope(ctx,local_50);
                pop_symbol_scope(ctx,local_48);
                bVar19 = bVar20;
              }
              else {
                bVar19 = false;
                if (TVar18 == 0x41) {
                  if (ctx->out_of_memory == 0) {
                    pSVar12 = (SymbolScope *)(*ctx->malloc)(0x20,ctx->malloc_data);
                    if (pSVar12 == (SymbolScope *)0x0) {
                      ctx->isfail = 1;
                      ctx->out_of_memory = 1;
                    }
                    else {
                      pSVar12->symbol = (char *)0x0;
                      pSVar12->datatype = (MOJOSHADER_astDataType *)0x0;
                      pSVar12->index = 0;
                      pSVar12->referenced = 0;
                      pSVar12->next = (ctx->usertypes).scope;
                      (ctx->usertypes).scope = pSVar12;
                    }
                  }
                  bVar19 = bVar20;
                  if (ctx->out_of_memory == 0) {
                    pSVar12 = (SymbolScope *)(*ctx->malloc)(0x20,ctx->malloc_data);
                    if (pSVar12 == (SymbolScope *)0x0) {
                      ctx->isfail = 1;
                      ctx->out_of_memory = 1;
                    }
                    else {
                      pSVar12->symbol = (char *)0x0;
                      pSVar12->datatype = (MOJOSHADER_astDataType *)0x0;
                      pSVar12->index = 0;
                      pSVar12->referenced = 0;
                      pSVar12->next = (ctx->variables).scope;
                      (ctx->variables).scope = pSVar12;
                    }
                  }
                }
              }
            }
          }
        }
        else if (tokenval == TOKEN_PREPROCESSING_ERROR) {
LAB_00123b0c:
          failf(ctx,"%s",pcVar7);
        }
        else {
          if (tokenval != TOKEN_PP_PRAGMA) goto LAB_00123adb;
          bVar19 = true;
          bVar20 = local_60 != 0;
          local_60 = 1;
          if (bVar20) {
            __assert_fail("!is_pragma",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                          ,0x116d,
                          "void parse_source(Context *, const char *, const char *, unsigned int, const MOJOSHADER_preprocessorDefine *, unsigned int, MOJOSHADER_includeOpen, MOJOSHADER_includeClose)"
                         );
          }
        }
      } while (tokenval != TOKEN_EOI);
      pSVar5 = local_40;
      map = local_50;
      pSVar12 = (ctx->usertypes).scope;
      while (pSVar12 != pSVar5) {
        pop_symbol(ctx,map);
        pSVar12 = (ctx->usertypes).scope;
      }
      p_Var3 = ctx->free;
      pvVar4 = ctx->malloc_data;
      while (-1 < yypParser->yyidx) {
        yy_pop_parser_stack(yypParser);
      }
      (*p_Var3)(yypParser,pvVar4);
    }
    preprocessor_end(ctx_00);
  }
  return;
}

Assistant:

static void parse_source(Context *ctx, const char *filename,
                         const char *source, unsigned int sourcelen,
                         const MOJOSHADER_preprocessorDefine *defines,
                         unsigned int define_count,
                         MOJOSHADER_includeOpen include_open,
                         MOJOSHADER_includeClose include_close)
{
    TokenData data;
    unsigned int tokenlen;
    Token tokenval;
    const char *token;
    int lemon_token;
    const char *fname;
    Preprocessor *pp;
    void *parser;

    if (!include_open) include_open = MOJOSHADER_internal_include_open;
    if (!include_close) include_close = MOJOSHADER_internal_include_close;

    pp = preprocessor_start(filename, source, sourcelen, include_open,
                            include_close, defines, define_count, 0,
                            MallocBridge, FreeBridge, ctx);
    if (pp == NULL)
    {
        assert(ctx->out_of_memory);  // shouldn't fail for any other reason.
        return;
    } // if

    parser = ParseHLSLAlloc(ctx->malloc, ctx->malloc_data);
    if (parser == NULL)
    {
        assert(ctx->out_of_memory);  // shouldn't fail for any other reason.
        preprocessor_end(pp);
        return;
    } // if

    // !!! FIXME: check if (parser == NULL)...

    init_builtins(ctx);

    SymbolScope *start_scope = ctx->usertypes.scope;

    #if DEBUG_COMPILER_PARSER
    ParseHLSLTrace(stdout, "COMPILER: ");
    #endif

    // Run the preprocessor/lexer/parser...
    int is_pragma = 0;   // !!! FIXME: remove this later when we can parse #pragma.
    int skipping = 0; // !!! FIXME: remove this later when we can parse #pragma.
    do {
        token = preprocessor_nexttoken(pp, &tokenlen, &tokenval);

        if (ctx->out_of_memory)
            break;

        fname = preprocessor_sourcepos(pp, &ctx->sourceline);
        ctx->sourcefile = fname ? stringcache(ctx->strcache, fname) : 0;

        if ((tokenval == TOKEN_HASH) || (tokenval == TOKEN_HASHHASH))
            tokenval = TOKEN_BAD_CHARS;

        if (tokenval == TOKEN_BAD_CHARS)
        {
            fail(ctx, "Bad characters in source file");
            continue;
        } // else if

        else if (tokenval == TOKEN_PREPROCESSING_ERROR)
        {
            fail(ctx, token);  // this happens to be null-terminated.
            continue;
        } // else if

        else if (tokenval == TOKEN_PP_PRAGMA)
        {
            assert(!is_pragma);
            is_pragma = 1;
            skipping = 1;
            continue;
        }

        else if (tokenval == ((Token) '\n'))
        {
            assert(is_pragma);
            is_pragma = 0;
            skipping = 0;
            continue;
        }

        else if (skipping)
        {
            continue;
        }

        // !!! FIXME: this is a mess, decide who should be doing this stuff, and only do it once.
        lemon_token = convert_to_lemon_token(ctx, token, tokenlen, tokenval);
        switch (lemon_token)
        {
            case TOKEN_HLSL_INT_CONSTANT:
                data.i64 = strtoi64(token, tokenlen);
                break;

            case TOKEN_HLSL_FLOAT_CONSTANT:
                data.dbl = strtodouble(token, tokenlen);
                break;

            case TOKEN_HLSL_USERTYPE:
                data.string = stringcache_len(ctx->strcache, token, tokenlen);
                data.datatype = get_usertype(ctx, data.string);  // !!! FIXME: do we need this? It's kind of useless during parsing.
                assert(data.datatype != NULL);
                break;

            case TOKEN_HLSL_STRING_LITERAL:
            case TOKEN_HLSL_IDENTIFIER:
                data.string = stringcache_len(ctx->strcache, token, tokenlen);
                break;

            default:
                data.i64 = 0;
                break;
        } // switch

        ParseHLSL(parser, lemon_token, data, ctx);

        // this probably isn't perfect, but it's good enough for surviving
        //  the parse. We'll sort out correctness once we have a tree.
        if (lemon_token == TOKEN_HLSL_LBRACE)
            push_scope(ctx);
        else if (lemon_token == TOKEN_HLSL_RBRACE)
            pop_scope(ctx);
    } while (tokenval != TOKEN_EOI);

    // Clean out extra usertypes; they are dummies until semantic analysis.
    while (ctx->usertypes.scope != start_scope)
        pop_symbol(ctx, &ctx->usertypes);

    ParseHLSLFree(parser, ctx->free, ctx->malloc_data);
    preprocessor_end(pp);
}